

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseSourceName(State *state)

{
  bool bVar1;
  int local_3c;
  undefined4 uStack_38;
  int length;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    uStack_38 = ((guard.state_)->parse_state).mangled_idx;
    length = ((guard.state_)->parse_state).out_cur_idx;
    copy.mangled_idx = ((guard.state_)->parse_state).prev_name_idx;
    copy.out_cur_idx = *(int *)&((guard.state_)->parse_state).field_0xc;
    local_3c = -1;
    bVar1 = ParseNumber(guard.state_,&local_3c);
    if ((bVar1) && (bVar1 = ParseIdentifier(guard.state_,local_3c), bVar1)) {
      state_local._7_1_ = true;
    }
    else {
      ((guard.state_)->parse_state).mangled_idx = uStack_38;
      ((guard.state_)->parse_state).out_cur_idx = length;
      ((guard.state_)->parse_state).prev_name_idx = copy.mangled_idx;
      *(int *)&((guard.state_)->parse_state).field_0xc = copy.out_cur_idx;
      state_local._7_1_ = false;
    }
  }
  copy._12_4_ = 1;
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseSourceName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  int length = -1;
  if (ParseNumber(state, &length) && ParseIdentifier(state, length)) {
    return true;
  }
  state->parse_state = copy;
  return false;
}